

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

void __thiscall CNode::CopyStats(CNode *this,CNodeStats *stats)

{
  ServiceFlags SVar1;
  uint32_t uVar2;
  bool bVar3;
  Network NVar4;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock35;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock33;
  unique_lock<std::mutex> local_78;
  direct_or_indirect local_68;
  uint local_58;
  char local_47;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  stats->nodeid = this->id;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::operator=
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&stats->addr,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&this->addr);
  uVar2 = (this->addr).super_CService.super_CNetAddr.m_scope_id;
  (stats->addr).super_CService.super_CNetAddr.m_net =
       (this->addr).super_CService.super_CNetAddr.m_net;
  (stats->addr).super_CService.super_CNetAddr.m_scope_id = uVar2;
  (stats->addr).super_CService.port = (this->addr).super_CService.port;
  SVar1 = (this->addr).nServices;
  (stats->addr).nTime.__d.__r = (this->addr).nTime.__d.__r;
  (stats->addr).nServices = SVar1;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::operator=
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&stats->addrBind,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&this->addrBind);
  uVar2 = (this->addrBind).super_CService.super_CNetAddr.m_scope_id;
  (stats->addrBind).super_CService.super_CNetAddr.m_net =
       (this->addrBind).super_CService.super_CNetAddr.m_net;
  (stats->addrBind).super_CService.super_CNetAddr.m_scope_id = uVar2;
  (stats->addrBind).super_CService.port = (this->addrBind).super_CService.port;
  SVar1 = (this->addrBind).nServices;
  (stats->addrBind).nTime.__d.__r = (this->addrBind).nTime.__d.__r;
  (stats->addrBind).nServices = SVar1;
  NVar4 = NET_ONION;
  if (this->m_inbound_onion == false) {
    NVar4 = CNetAddr::GetNetClass((CNetAddr *)&this->addr);
  }
  stats->m_network = NVar4;
  (stats->m_last_send).__r = (this->m_last_send)._M_i.__r;
  (stats->m_last_recv).__r = (this->m_last_recv)._M_i.__r;
  (stats->m_last_tx_time).__r = (this->m_last_tx_time)._M_i.__r;
  (stats->m_last_block_time).__r = (this->m_last_block_time)._M_i.__r;
  (stats->m_connected).__r = (this->m_connected).__r;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&stats->m_addr_name,&this->m_addr_name);
  stats->nVersion = (this->nVersion).super___atomic_base<int>._M_i;
  local_68.indirect_contents.indirect = (char *)&this->m_subver_mutex;
  local_68.direct[8] = '\0';
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_68.indirect_contents);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&stats->cleanSubVer,&this->cleanSubVer);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_68.indirect_contents)
  ;
  stats->fInbound = this->m_conn_type == INBOUND;
  stats->m_bip152_highbandwidth_to = (bool)((this->m_bip152_highbandwidth_to)._M_base._M_i & 1);
  stats->m_bip152_highbandwidth_from = (bool)((this->m_bip152_highbandwidth_from)._M_base._M_i & 1);
  local_68.indirect_contents.indirect = (char *)&this->cs_vSend;
  local_68.direct[8] = '\0';
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_68.indirect_contents);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::operator=(&(stats->mapSendBytesPerMsgType)._M_t,&(this->mapSendBytesPerMsgType)._M_t);
  stats->nSendBytes = this->nSendBytes;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_68.indirect_contents)
  ;
  local_78._M_device = &(this->cs_vRecv).super_mutex;
  local_78._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_78);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::operator=(&(stats->mapRecvBytesPerMsgType)._M_t,&(this->mapRecvBytesPerMsgType)._M_t);
  stats->nRecvBytes = this->nRecvBytes;
  (*((this->m_transport)._M_t.super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>._M_t
     .super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
     super__Head_base<0UL,_Transport_*,_false>._M_head_impl)->_vptr_Transport[2])(&local_68);
  stats->m_transport_type = local_68.direct[0];
  if (local_47 == '\x01') {
    s.m_size = 0x20;
    s.m_data = (uchar *)(local_68.direct + 1);
    HexStr_abi_cxx11_(&local_40,s);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&stats->m_session_id,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_78);
  stats->m_permission_flags = this->m_permission_flags;
  (stats->m_last_ping_time).__r = (this->m_last_ping_time)._M_i.__r;
  (stats->m_min_ping_time).__r = (this->m_min_ping_time)._M_i.__r;
  GetAddrLocal((CService *)&local_68.indirect_contents,this);
  bVar3 = CNetAddr::IsValid((CNetAddr *)&local_68.indirect_contents);
  if (bVar3) {
    CService::ToStringAddrPort_abi_cxx11_(&local_40,(CService *)&local_68.indirect_contents);
  }
  else {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&stats->addrLocal,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  stats->m_conn_type = this->m_conn_type;
  if (0x10 < local_58) {
    free(local_68.indirect_contents.indirect);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CNode::CopyStats(CNodeStats& stats)
{
    stats.nodeid = this->GetId();
    X(addr);
    X(addrBind);
    stats.m_network = ConnectedThroughNetwork();
    X(m_last_send);
    X(m_last_recv);
    X(m_last_tx_time);
    X(m_last_block_time);
    X(m_connected);
    X(m_addr_name);
    X(nVersion);
    {
        LOCK(m_subver_mutex);
        X(cleanSubVer);
    }
    stats.fInbound = IsInboundConn();
    X(m_bip152_highbandwidth_to);
    X(m_bip152_highbandwidth_from);
    {
        LOCK(cs_vSend);
        X(mapSendBytesPerMsgType);
        X(nSendBytes);
    }
    {
        LOCK(cs_vRecv);
        X(mapRecvBytesPerMsgType);
        X(nRecvBytes);
        Transport::Info info = m_transport->GetInfo();
        stats.m_transport_type = info.transport_type;
        if (info.session_id) stats.m_session_id = HexStr(*info.session_id);
    }
    X(m_permission_flags);

    X(m_last_ping_time);
    X(m_min_ping_time);

    // Leave string empty if addrLocal invalid (not filled in yet)
    CService addrLocalUnlocked = GetAddrLocal();
    stats.addrLocal = addrLocalUnlocked.IsValid() ? addrLocalUnlocked.ToStringAddrPort() : "";

    X(m_conn_type);
}